

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pzsfulmat.cpp
# Opt level: O2

int __thiscall
TPZSFMatrix<long_double>::Subst_Backward(TPZSFMatrix<long_double> *this,TPZFMatrix<long_double> *B)

{
  longdouble lVar1;
  long lVar2;
  int iVar3;
  undefined4 extraout_var;
  undefined4 extraout_var_00;
  undefined4 extraout_var_01;
  undefined4 extraout_var_02;
  int iVar4;
  long lVar5;
  long lVar6;
  int64_t j;
  long lVar7;
  longdouble *plVar8;
  long lVar9;
  longdouble in_ST0;
  longdouble lVar10;
  longdouble in_ST1;
  longdouble in_ST2;
  longdouble in_ST3;
  longdouble in_ST4;
  longdouble in_ST5;
  longdouble in_ST6;
  longdouble local_7c;
  longdouble *local_70;
  longdouble local_48;
  
  lVar2 = (B->super_TPZMatrix<long_double>).super_TPZBaseMatrix.fRow;
  iVar3 = (*(this->super_TPZMatrix<long_double>).super_TPZBaseMatrix.super_TPZSavable.
            _vptr_TPZSavable[0xc])();
  iVar4 = 0;
  if ((lVar2 == CONCAT44(extraout_var,iVar3)) &&
     ((this->super_TPZMatrix<long_double>).super_TPZBaseMatrix.fDecomposed != '\0')) {
    iVar3 = (*(B->super_TPZMatrix<long_double>).super_TPZBaseMatrix.super_TPZSavable.
              _vptr_TPZSavable[0x10])(B);
    if (iVar3 != 0) {
      TPZMatrix<long_double>::Error
                ("virtual int TPZSFMatrix<long double>::Subst_Backward(TPZFMatrix<TVar> *) const [TVar = long double]"
                 ,"Subst_Backward <the matrix result can not be simetric>");
    }
    local_70 = this->fElem;
    iVar3 = (*(this->super_TPZMatrix<long_double>).super_TPZBaseMatrix.super_TPZSavable.
              _vptr_TPZSavable[0x4b])(this);
    local_70 = local_70 + CONCAT44(extraout_var_00,iVar3);
    iVar3 = (*(this->super_TPZMatrix<long_double>).super_TPZBaseMatrix.super_TPZSavable.
              _vptr_TPZSavable[0xc])(this);
    lVar2 = CONCAT44(extraout_var_01,iVar3);
    while (lVar6 = lVar2, 0 < lVar6) {
      local_70 = local_70 + -1;
      lVar2 = lVar6 + -1;
      for (lVar7 = 0; lVar7 < (B->super_TPZMatrix<long_double>).super_TPZBaseMatrix.fCol;
          lVar7 = lVar7 + 1) {
        iVar3 = (*(this->super_TPZMatrix<long_double>).super_TPZBaseMatrix.super_TPZSavable.
                  _vptr_TPZSavable[0xc])(this);
        lVar9 = CONCAT44(extraout_var_02,iVar3);
        lVar5 = -lVar9;
        local_7c = (longdouble)0;
        plVar8 = local_70;
        lVar10 = in_ST0;
        in_ST0 = in_ST1;
        in_ST1 = in_ST2;
        in_ST2 = in_ST3;
        in_ST3 = in_ST4;
        in_ST4 = in_ST5;
        in_ST5 = in_ST6;
        while (lVar5 = lVar5 + 1, lVar6 < lVar9) {
          lVar9 = lVar9 + -1;
          lVar1 = *plVar8;
          (*(B->super_TPZMatrix<long_double>).super_TPZBaseMatrix.super_TPZSavable._vptr_TPZSavable
            [0x24])(B,lVar9,lVar7);
          local_7c = local_7c + lVar1 * lVar10;
          plVar8 = plVar8 + lVar5;
          lVar10 = in_ST0;
          in_ST0 = in_ST1;
          in_ST1 = in_ST2;
          in_ST2 = in_ST3;
          in_ST3 = in_ST4;
          in_ST4 = in_ST5;
        }
        (*(B->super_TPZMatrix<long_double>).super_TPZBaseMatrix.super_TPZSavable._vptr_TPZSavable
          [0x24])(B,lVar2,lVar7);
        local_48 = (lVar10 - local_7c) / *plVar8;
        in_ST6 = in_ST5;
        (*(B->super_TPZMatrix<long_double>).super_TPZBaseMatrix.super_TPZSavable._vptr_TPZSavable
          [0x23])(B,lVar2,lVar7,&local_48);
      }
    }
    iVar4 = 1;
  }
  return iVar4;
}

Assistant:

int
TPZSFMatrix<TVar> ::Subst_Backward( TPZFMatrix<TVar>  *B ) const
{
	if ( (B->Rows() != this->Dim()) || !this->fDecomposed )
		return( 0 );
	
	if ( B->IsSymmetric() )
		TPZMatrix<TVar> ::Error(__PRETTY_FUNCTION__, "Subst_Backward <the matrix result can not be simetric>" );
	
	TVar *ptr_k = &fElem[ Size()-1 ];
	for ( int64_t k = this->Dim()-1; k >= 0; k--, ptr_k-- )
		for ( int64_t j = 0; j < B->Cols(); j++ )
		{
			// Faz sum = SOMA( A[k,i] * B[i,j] ); i = N, ..., k+1.
			//
			TVar sum = 0.0;
			TVar *pk = ptr_k;
			for ( int64_t i = this->Dim()-1; i > k; i-- )
			{
				if constexpr(is_complex<TVar>::value){
					sum += std::conj(*pk) * B->GetVal( i, j );
				}else{
					sum += (*pk) * B->GetVal( i, j );
				}
				pk -= i;
			}
			
			// Faz B[k,j] = (B[k,j] - sum) / A[k,k].
			//
			B->PutVal( k, j, (B->GetVal(k, j) - sum) / *pk );
		}
	
	return( 1 );
}